

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderMoveToAttributeNo(xmlTextReaderPtr reader,int no)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlNodePtr pxVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = -1;
  if (((reader != (xmlTextReaderPtr)0x0) && (pxVar1 = reader->node, pxVar1 != (xmlNodePtr)0x0)) &&
     (pxVar1->type == XML_ELEMENT_NODE)) {
    reader->curnode = (xmlNodePtr)0x0;
    pxVar3 = (xmlNodePtr)&pxVar1->nsDef;
    iVar4 = -1;
    iVar5 = 2;
    do {
      iVar4 = iVar4 + 1;
      pxVar3 = (xmlNodePtr)pxVar3->_private;
      iVar5 = iVar5 + -1;
      if (no <= iVar4) break;
    } while (pxVar3 != (xmlNodePtr)0x0);
    if (pxVar3 == (xmlNodePtr)0x0) {
      pxVar3 = (xmlNodePtr)pxVar1->properties;
      iVar2 = 0;
      if (pxVar3 != (xmlNodePtr)0x0) {
        if (iVar4 < no) {
          iVar4 = no;
        }
        iVar4 = iVar4 + iVar5;
        do {
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) goto LAB_0016e8f1;
          pxVar3 = pxVar3->next;
        } while (pxVar3 != (_xmlNode *)0x0);
      }
    }
    else {
LAB_0016e8f1:
      reader->curnode = pxVar3;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int
xmlTextReaderMoveToAttributeNo(xmlTextReaderPtr reader, int no) {
    int i;
    xmlAttrPtr cur;
    xmlNsPtr ns;

    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(-1);

    reader->curnode = NULL;

    ns = reader->node->nsDef;
    for (i = 0;(i < no) && (ns != NULL);i++) {
	ns = ns->next;
    }
    if (ns != NULL) {
	reader->curnode = (xmlNodePtr) ns;
	return(1);
    }

    cur = reader->node->properties;
    if (cur == NULL)
	return(0);
    for (;i < no;i++) {
	cur = cur->next;
	if (cur == NULL)
	    return(0);
    }
    /* TODO walk the DTD if present */

    reader->curnode = (xmlNodePtr) cur;
    return(1);
}